

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmContinueCommand.h
# Opt level: O0

cmCommand * __thiscall cmContinueCommand::Clone(cmContinueCommand *this)

{
  cmCommand *this_00;
  cmContinueCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmContinueCommand((cmContinueCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmContinueCommand;
    }